

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O0

PmError alsa_poll(PmInternal *midi)

{
  int iVar1;
  PmInternal *midi_1;
  int i;
  int rslt;
  snd_seq_event_t *ev;
  PmInternal *midi_local;
  
  while (iVar1 = snd_seq_event_input_pending(seq,1), 0 < iVar1) {
    while (iVar1 = snd_seq_event_input_pending(seq,0), 0 < iVar1) {
      iVar1 = snd_seq_event_input(seq);
      if (iVar1 < 0) {
        if (iVar1 == -0x1c) {
          for (midi_1._0_4_ = 0; (int)midi_1 < pm_descriptor_index; midi_1._0_4_ = (int)midi_1 + 1)
          {
            if ((descriptors[(int)midi_1].pub.input != 0) &&
               (descriptors[(int)midi_1].internalDescriptor != (void *)0x0)) {
              Pm_SetOverflow(*(PmQueue **)((long)descriptors[(int)midi_1].internalDescriptor + 0x20)
                            );
            }
          }
        }
      }
      else {
        handle_event(_i);
      }
    }
  }
  return pmNoData;
}

Assistant:

static PmError alsa_poll(PmInternal *midi)
{
    snd_seq_event_t *ev;
    /* expensive check for input data, gets data from device: */
    while (snd_seq_event_input_pending(seq, TRUE) > 0) {
        /* cheap check on local input buffer */
        while (snd_seq_event_input_pending(seq, FALSE) > 0) {
            /* check for and ignore errors, e.g. input overflow */
            /* note: if there's overflow, this should be reported
             * all the way through to client. Since input from all
             * devices is merged, we need to find all input devices
             * and set all to the overflow state.
             * NOTE: this assumes every input is ALSA based.
             */
            int rslt = snd_seq_event_input(seq, &ev);
            if (rslt >= 0) {
                handle_event(ev);
            } else if (rslt == -ENOSPC) {
                int i;
                for (i = 0; i < pm_descriptor_index; i++) {
                    if (descriptors[i].pub.input) {
                        PmInternal *midi = (PmInternal *) 
                                descriptors[i].internalDescriptor;
                        /* careful, device may not be open! */
                        if (midi) Pm_SetOverflow(midi->queue);
                    }
                }
            }
        }
    }
    return pmNoError;
}